

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O2

Index __thiscall
andres::Partition<unsigned_long>::find(Partition<unsigned_long> *this,Index element)

{
  pointer puVar1;
  Index IVar2;
  Index IVar3;
  Index root;
  
  puVar1 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar2 = element;
  do {
    IVar3 = IVar2;
    IVar2 = puVar1[IVar3];
  } while (puVar1[IVar3] != IVar3);
  while (element != IVar3) {
    IVar2 = puVar1[element];
    puVar1[element] = IVar3;
    element = IVar2;
  }
  return IVar3;
}

Assistant:

inline typename Partition<T>::Index
Partition<T>::find(
    Index element // copy to work with
) {
    // find the root
    Index root = element;
    while(parents_[static_cast<std::size_t>(root)] != root) {
        root = parents_[static_cast<std::size_t>(root)];
    }
    // path compression
    while(element != root) {
        const Index tmp = parents_[static_cast<std::size_t>(element)];
        parents_[static_cast<std::size_t>(element)] = root;
        element = tmp;
    }
    return root;
}